

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * Balloc(int k)

{
  Bigint *pBVar1;
  int iVar2;
  
  iVar2 = 1 << ((byte)k & 0x1f);
  pBVar1 = (Bigint *)
           __ckd_malloc__((long)iVar2 * 4 + 0x23U & 0x7fffffff8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                          ,0x1a9);
  if (pBVar1 != (Bigint *)0x0) {
    pBVar1->k = k;
    pBVar1->maxwds = iVar2;
    pBVar1->sign = 0;
    pBVar1->wds = 0;
  }
  return pBVar1;
}

Assistant:

static Bigint *
Balloc(int k)
{
    int x;
    Bigint *rv;
    unsigned int len;

    x = 1 << k;
    len = (sizeof(Bigint) + (x-1)*sizeof(ULong) + sizeof(double) - 1)
        /sizeof(double);

    rv = (Bigint*)MALLOC(len*sizeof(double));
    if (rv == NULL)
        return NULL;

    rv->k = k;
    rv->maxwds = x;
    rv->sign = rv->wds = 0;
    return rv;
}